

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpAggregator.cpp
# Opt level: O0

void __thiscall HighsLpAggregator::addRow(HighsLpAggregator *this,HighsInt row,double weight)

{
  undefined4 in_ESI;
  double **in_RDI;
  undefined8 in_XMM0_Qa;
  HighsInt i;
  HighsInt *inds;
  double *vals;
  HighsInt len;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar1;
  HighsInt *in_stack_ffffffffffffffd0;
  HighsInt in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  HighsInt index;
  undefined4 in_stack_fffffffffffffff0;
  
  HighsLpRelaxation::getRow
            ((HighsLpRelaxation *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,
             (HighsInt **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI);
  for (iVar1 = 0; index = (HighsInt)((ulong)in_XMM0_Qa >> 0x20), iVar1 != in_stack_ffffffffffffffe4;
      iVar1 = iVar1 + 1) {
    HighsSparseVectorSum::add
              ((HighsSparseVectorSum *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),index,
               (double)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  HighsLpRelaxation::getLp((HighsLpRelaxation *)0x601e0f);
  HighsSparseVectorSum::add
            ((HighsSparseVectorSum *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),index,
             (double)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

void HighsLpAggregator::addRow(HighsInt row, double weight) {
  HighsInt len;
  const double* vals;
  const HighsInt* inds;
  lprelaxation.getRow(row, len, inds, vals);

  for (HighsInt i = 0; i != len; ++i) vectorsum.add(inds[i], weight * vals[i]);

  vectorsum.add(lprelaxation.getLp().num_col_ + row, -weight);
}